

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_lookup_cache.hpp
# Opt level: O0

int64_t __thiscall
duckdb::DateLookupCache<duckdb::DatePart::MonthOperator>::ExtractElement
          (DateLookupCache<duckdb::DatePart::MonthOperator> *this,date_t date,ValidityMask *mask,
          idx_t idx)

{
  bool bVar1;
  type puVar2;
  date_t in_ESI;
  TemplatedValidityMask<unsigned_long> *in_RDI;
  size_t in_stack_ffffffffffffffb8;
  bool local_35;
  ulong local_8;
  
  local_35 = (uint)in_ESI.days < 0x7390;
  if (local_35) {
    GetDateCacheEntry((date_t)0x0);
    puVar2 = unique_ptr<unsigned_short[],_std::default_delete<unsigned_short>,_false>::operator[]
                       ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short>,_false> *)
                        in_RDI,in_stack_ffffffffffffffb8);
    local_8 = (ulong)*puVar2;
  }
  else {
    bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(in_ESI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_8 = DatePart::MonthOperator::Operation<duckdb::date_t,long>((date_t)0x0);
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid(in_RDI,in_stack_ffffffffffffffb8);
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

int64_t ExtractElement(date_t date, ValidityMask &mask, idx_t idx) const {
		if (DUCKDB_UNLIKELY(date.days < CACHE_MIN_DATE || date.days >= CACHE_MAX_DATE)) {
			if (DUCKDB_UNLIKELY(!Value::IsFinite(date))) {
				mask.SetInvalid(idx);
				return 0;
			}
			return OP::template Operation<date_t, int64_t>(date);
		}
		return cache[GetDateCacheEntry(date)];
	}